

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STInteger.cpp
# Opt level: O3

string * __thiscall
jbcoin::STInteger<unsigned_short>::getText_abi_cxx11_
          (string *__return_storage_ptr__,STInteger<unsigned_short> *this)

{
  ushort uVar1;
  _Base_ptr p_Var2;
  unsigned_short in;
  unsigned_short extraout_DX;
  _Base_ptr in_RDX;
  _Base_ptr p_Var3;
  
  if (((this->super_STBase).fName)->fieldCode == sfLedgerEntryType) {
    LedgerFormats::getInstance();
    in_RDX = LedgerFormats::getInstance::instance.super_KnownFormats<jbcoin::LedgerEntryType>.
             m_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (LedgerFormats::getInstance::instance.super_KnownFormats<jbcoin::LedgerEntryType>.m_types.
        _M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) goto LAB_001b232d;
    uVar1 = this->value_;
    p_Var2 = &LedgerFormats::getInstance::instance.super_KnownFormats<jbcoin::LedgerEntryType>.
              m_types._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var3 = LedgerFormats::getInstance::instance.super_KnownFormats<jbcoin::LedgerEntryType>.
             m_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if ((int)(uint)uVar1 <= (int)p_Var3[1]._M_color) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < (int)(uint)uVar1];
    } while (p_Var3 != (_Base_ptr)0x0);
    in_RDX = &LedgerFormats::getInstance::instance.super_KnownFormats<jbcoin::LedgerEntryType>.
              m_types._M_t._M_impl.super__Rb_tree_header._M_header;
    if ((((_Rb_tree_header *)p_Var2 ==
          &LedgerFormats::getInstance::instance.super_KnownFormats<jbcoin::LedgerEntryType>.m_types.
           _M_t._M_impl.super__Rb_tree_header) || ((int)(uint)uVar1 < (int)p_Var2[1]._M_color)) ||
       (p_Var3 = p_Var2[1]._M_parent, p_Var3 == (_Base_ptr)0x0)) goto LAB_001b232d;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    p_Var2 = p_Var3[1]._M_left;
    p_Var3 = p_Var3[1]._M_right;
LAB_001b239b:
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,p_Var2,
               (long)&p_Var2->_M_color + (long)&p_Var3->_M_color);
  }
  else {
LAB_001b232d:
    in = (unsigned_short)in_RDX;
    if (((this->super_STBase).fName)->fieldCode == sfTransactionType) {
      TxFormats::getInstance();
      uVar1 = this->value_;
      in = extraout_DX;
      if (TxFormats::getInstance::instance.super_KnownFormats<jbcoin::TxType>.m_types._M_t._M_impl.
          super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var2 = &TxFormats::getInstance::instance.super_KnownFormats<jbcoin::TxType>.m_types._M_t.
                  _M_impl.super__Rb_tree_header._M_header;
        p_Var3 = TxFormats::getInstance::instance.super_KnownFormats<jbcoin::TxType>.m_types._M_t.
                 _M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          if ((int)(uint)uVar1 <= (int)p_Var3[1]._M_color) {
            p_Var2 = p_Var3;
          }
          p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < (int)(uint)uVar1];
        } while (p_Var3 != (_Base_ptr)0x0);
        in = uVar1;
        if ((((_Rb_tree_header *)p_Var2 !=
              &TxFormats::getInstance::instance.super_KnownFormats<jbcoin::TxType>.m_types._M_t.
               _M_impl.super__Rb_tree_header) && ((int)p_Var2[1]._M_color <= (int)(uint)uVar1)) &&
           (p_Var3 = p_Var2[1]._M_parent, p_Var3 != (_Base_ptr)0x0)) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          p_Var2 = p_Var3[1]._M_left;
          p_Var3 = p_Var3[1]._M_right;
          goto LAB_001b239b;
        }
      }
    }
    else {
      uVar1 = this->value_;
    }
    beast::lexicalCastThrow<std::__cxx11::string,unsigned_short>
              (__return_storage_ptr__,(beast *)(ulong)uVar1,in);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
STUInt16::getText () const
{
    if (getFName () == sfLedgerEntryType)
    {
        auto item = LedgerFormats::getInstance ().findByType (
            static_cast <LedgerEntryType> (value_));

        if (item != nullptr)
            return item->getName ();
    }

    if (getFName () == sfTransactionType)
    {
        auto item =TxFormats::getInstance().findByType (
            static_cast <TxType> (value_));

        if (item != nullptr)
            return item->getName ();
    }

    return beast::lexicalCastThrow <std::string> (value_);
}